

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O1

void insertion_sort(uchar **strings,int n,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  uchar **ppuVar4;
  byte bVar5;
  uchar **ppuVar6;
  byte bVar7;
  long lVar8;
  
  if (1 < n) {
    ppuVar4 = strings;
    do {
      puVar1 = ppuVar4[1];
      ppuVar4 = ppuVar4 + 1;
      for (ppuVar6 = ppuVar4; strings < ppuVar6; ppuVar6 = ppuVar6 + -1) {
        puVar2 = ppuVar6[-1];
        bVar7 = puVar2[depth];
        bVar5 = puVar1[depth];
        if ((bVar7 != 0) && (lVar8 = depth + 1, bVar7 == bVar5)) {
          do {
            bVar7 = puVar2[lVar8];
            bVar5 = puVar1[lVar8];
            if (bVar7 == 0) break;
            lVar8 = lVar8 + 1;
          } while (bVar7 == bVar5);
        }
        if (bVar7 <= bVar5) break;
        *ppuVar6 = puVar2;
      }
      *ppuVar6 = puVar1;
      bVar3 = 2 < n;
      n = n + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

static void
insertion_sort(unsigned char** strings, int n, size_t depth)
{
	for (unsigned char** i = strings + 1; --n > 0; ++i) {
		unsigned char** j = i;
		unsigned char* tmp = *i;
		while (j > strings) {
			unsigned char* s = *(j-1)+depth;
			unsigned char* t = tmp+depth;
			while (*s == *t && *s) {
				++s;
				++t;
			}
			if (*s <= *t) break;
			*j = *(j-1);
			--j;
		}
		*j = tmp;
	}
}